

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoSimdBitmask<wabt::interp::Simd<int,(unsigned_char)4>>(Thread *this)

{
  u8 i;
  long lVar1;
  uint value;
  Simd<int,_(unsigned_char)__x04_> SVar2;
  Simd<int,_(unsigned_char)__x04_> val;
  int local_18 [4];
  
  SVar2 = Pop<wabt::interp::Simd<int,(unsigned_char)4>>(this);
  local_18[0] = SVar2.v[0];
  local_18[1] = SVar2.v[1];
  local_18[2] = SVar2.v[2];
  local_18[3] = SVar2.v[3];
  lVar1 = 0;
  value = 0;
  do {
    value = value | local_18[lVar1] >> 0x1f & 1 << ((byte)lVar1 & 0x1f);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  Push<unsigned_int>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBitmask() {
  auto val = Pop<S>();
  u32 result = 0;
  for (u8 i = 0; i < S::lanes; ++i) {
    if (val[i] < 0) {
      result |= 1 << i;
    }
  }
  Push(result);
  return RunResult::Ok;
}